

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O1

string * __thiscall
Json::(anonymous_namespace)::valueToString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,double value,
          bool useSpecialFloats,uint precision)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  char buffer [36];
  char formatString [15];
  char local_58 [49];
  char local_27 [15];
  
  snprintf(local_27,0xf,"%%.%dg");
  if ((ulong)ABS(value) < 0x7ff0000000000000) {
    iVar1 = snprintf(local_58,0x24,local_27,value);
    if (0 < iVar1) {
      lVar4 = 0;
      do {
        if (local_58[lVar4] == ',') {
          local_58[lVar4] = '.';
        }
        lVar4 = lVar4 + 1;
      } while (iVar1 != lVar4);
    }
    pcVar5 = strchr(local_58,0x2e);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = strchr(local_58,0x65);
      if (pcVar5 == (char *)0x0) {
        sVar3 = strlen(local_58);
        (local_58 + sVar3)[0] = '.';
        (local_58 + sVar3)[1] = '0';
        local_58[sVar3 + 2] = '\0';
      }
    }
  }
  else {
    if (NAN(value)) {
      pcVar2 = "NaN";
      pcVar5 = "null";
    }
    else if (0.0 <= value) {
      pcVar2 = "Infinity";
      pcVar5 = "1e+9999";
    }
    else {
      pcVar2 = "-Infinity";
      pcVar5 = "-1e+9999";
    }
    if ((char)this != '\0') {
      pcVar5 = pcVar2;
    }
    iVar1 = snprintf(local_58,0x24,pcVar5);
  }
  if (-1 < iVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar3 = strlen(local_58);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,local_58,local_58 + sVar3);
    return __return_storage_ptr__;
  }
  __assert_fail("len >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmjsoncpp/src/lib_json/json_writer.cpp"
                ,0xcc,
                "std::string Json::(anonymous namespace)::valueToString(double, bool, unsigned int)"
               );
}

Assistant:

JSONCPP_STRING valueToString(double value, bool useSpecialFloats, unsigned int precision) {
  // Allocate a buffer that is more than large enough to store the 16 digits of
  // precision requested below.
  char buffer[36];
  int len = -1;

  char formatString[15];
  snprintf(formatString, sizeof(formatString), "%%.%dg", precision);

  // Print into the buffer. We need not request the alternative representation
  // that always has a decimal point because JSON doesn't distingish the
  // concepts of reals and integers.
  if (isfinite(value)) {
    len = snprintf(buffer, sizeof(buffer), formatString, value);
    fixNumericLocale(buffer, buffer + len);

    // try to ensure we preserve the fact that this was given to us as a double on input
    if (!strchr(buffer, '.') && !strchr(buffer, 'e')) {
      strcat(buffer, ".0");
    }

  } else {
    // IEEE standard states that NaN values will not compare to themselves
    if (value != value) {
      len = snprintf(buffer, sizeof(buffer), useSpecialFloats ? "NaN" : "null");
    } else if (value < 0) {
      len = snprintf(buffer, sizeof(buffer), useSpecialFloats ? "-Infinity" : "-1e+9999");
    } else {
      len = snprintf(buffer, sizeof(buffer), useSpecialFloats ? "Infinity" : "1e+9999");
    }
  }
  assert(len >= 0);
  return buffer;
}